

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase.h
# Opt level: O3

void __thiscall
soplex::
SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::changeElement(SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *this,int i,int j,
               number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *val,bool scale)

{
  uint *puVar1;
  bool bVar2;
  Tolerances *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar3;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar4;
  Real a;
  undefined8 uVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  int *piVar9;
  char *pcVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  char *__filename;
  undefined7 in_register_00000081;
  long lVar14;
  long lVar15;
  long lVar16;
  Item *this_02;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  uint local_190;
  uint local_18c;
  Item *local_188;
  undefined4 local_17c;
  undefined1 local_178 [16];
  undefined1 local_168 [16];
  undefined1 local_158 [16];
  uint local_148 [3];
  undefined3 uStack_13b;
  int iStack_138;
  bool bStack_134;
  undefined8 local_130;
  cpp_dec_float<100U,_int,_void> local_128;
  undefined8 local_d8;
  undefined8 uStack_d0;
  uint local_c8 [2];
  uint auStack_c0 [2];
  uint local_b8 [2];
  uint auStack_b0 [2];
  uint local_a8 [2];
  uint auStack_a0 [2];
  uint local_98 [2];
  uint auStack_90 [2];
  uint local_88;
  uint uStack_84;
  uint uStack_80;
  uint uStack_7c;
  undefined8 local_78;
  undefined8 uStack_70;
  uint local_68;
  uint uStack_64;
  uint uStack_60;
  uint uStack_5c;
  uint local_58;
  uint uStack_54;
  uint uStack_50;
  uint uStack_4c;
  int local_48;
  undefined1 local_44;
  undefined8 local_40;
  
  if ((j | i) < 0) {
    return;
  }
  local_17c = (undefined4)CONCAT71(in_register_00000081,scale);
  this_02 = (this->
            super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).
            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .set.theitem +
            (this->
            super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).
            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .set.thekey[i].idx;
  local_188 = (this->
              super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .set.theitem +
              (this->
              super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .set.thekey[j].idx;
  local_c8 = *(uint (*) [2])(val->m_backend).data._M_elems;
  auStack_c0 = *(uint (*) [2])((val->m_backend).data._M_elems + 2);
  local_b8 = *(uint (*) [2])((val->m_backend).data._M_elems + 4);
  auStack_b0 = *(uint (*) [2])((val->m_backend).data._M_elems + 6);
  local_a8 = *(uint (*) [2])((val->m_backend).data._M_elems + 8);
  auStack_a0 = *(uint (*) [2])((val->m_backend).data._M_elems + 10);
  local_98 = *(uint (*) [2])((val->m_backend).data._M_elems + 0xc);
  auStack_90 = *(uint (*) [2])((val->m_backend).data._M_elems + 0xe);
  iVar8 = (val->m_backend).exp;
  bVar2 = (val->m_backend).neg;
  local_d8._0_4_ = (val->m_backend).fpclass;
  local_d8._4_4_ = (val->m_backend).prec_elem;
  uStack_d0 = 0;
  this_00 = (this->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr;
  this_01 = (this->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_01->_M_use_count = this_01->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_01->_M_use_count = this_01->_M_use_count + 1;
    }
  }
  local_190 = j;
  local_18c = i;
  a = Tolerances::epsilon(this_00);
  local_128.data._M_elems[0xc] = local_98[0];
  local_128.data._M_elems[0xd] = local_98[1];
  local_128.data._M_elems[0xe] = auStack_90[0];
  local_128.data._M_elems[0xf] = auStack_90[1];
  local_128.data._M_elems[8] = local_a8[0];
  local_128.data._M_elems[9] = local_a8[1];
  local_128.data._M_elems[10] = auStack_a0[0];
  local_128.data._M_elems[0xb] = auStack_a0[1];
  local_128.data._M_elems[4] = local_b8[0];
  local_128.data._M_elems[5] = local_b8[1];
  local_128.data._M_elems[6] = auStack_b0[0];
  local_128.data._M_elems[7] = auStack_b0[1];
  local_128.data._M_elems[0] = local_c8[0];
  local_128.data._M_elems[1] = local_c8[1];
  uVar5 = local_128.data._M_elems._0_8_;
  local_128.data._M_elems[2] = auStack_c0[0];
  local_128.data._M_elems[3] = auStack_c0[1];
  local_128.fpclass = (fpclass_type)local_d8;
  local_128.prec_elem = local_d8._4_4_;
  local_128.neg = bVar2;
  if ((bVar2 != false) &&
     (local_128.data._M_elems[0] = local_c8[0],
     local_128.data._M_elems[0] != 0 || (fpclass_type)local_d8 != cpp_dec_float_finite)) {
    local_128.neg = (bool)(bVar2 ^ 1);
  }
  bVar2 = false;
  local_128.data._M_elems._0_8_ = uVar5;
  local_128.exp = iVar8;
  if (((fpclass_type)local_d8 != cpp_dec_float_NaN) && (!NAN(a))) {
    local_130._0_4_ = cpp_dec_float_finite;
    local_130._4_4_ = 0x10;
    local_178 = (undefined1  [16])0x0;
    local_168 = (undefined1  [16])0x0;
    local_158 = (undefined1  [16])0x0;
    local_148[0] = 0;
    local_148[1] = 0;
    stack0xfffffffffffffec0 = 0;
    uStack_13b = 0;
    iStack_138 = 0;
    bStack_134 = false;
    boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
              ((cpp_dec_float<100u,int,void> *)local_178,a);
    iVar8 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                      (&local_128,(cpp_dec_float<100U,_int,_void> *)local_178);
    bVar2 = 0 < iVar8;
  }
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
  }
  uVar7 = local_18c;
  uVar6 = local_190;
  if (!bVar2) {
    pNVar3 = (this_02->data).
             super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .m_elem;
    if (pNVar3 == (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)0x0) {
      return;
    }
    pcVar10 = (char *)(long)(this_02->data).
                            super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            .memused;
    if ((long)pcVar10 < 1) {
      return;
    }
    lVar14 = 0;
    while (*(uint *)((long)(&pNVar3->val + 1) + lVar14) != local_190) {
      lVar14 = lVar14 + 0x54;
      if ((long)pcVar10 * 0x54 - lVar14 == 0) {
        return;
      }
    }
    pNVar4 = (local_188->data).
             super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .m_elem;
    if (pNVar4 == (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)0x0) {
      return;
    }
    lVar14 = (long)(local_188->data).
                   super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .memused;
    if (lVar14 < 1) {
      return;
    }
    lVar15 = 0;
    while (*(uint *)((long)(&pNVar4->val + 1) + lVar15) != local_18c) {
      lVar15 = lVar15 + 0x54;
      if (lVar14 * 0x54 - lVar15 == 0) {
        return;
      }
    }
    piVar9 = &pNVar3->idx;
    __filename = (char *)0x0;
    do {
      if (*piVar9 == local_190) goto LAB_003a91cf;
      __filename = __filename + 1;
      piVar9 = piVar9 + 0x15;
    } while (pcVar10 != __filename);
    __filename = (char *)0xffffffff;
LAB_003a91cf:
    SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::remove((SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *)this_02,__filename);
    pNVar3 = (local_188->data).
             super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .m_elem;
    pcVar10 = (char *)0xffffffff;
    if ((pNVar3 != (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *)0x0) &&
       (uVar11 = (ulong)(local_188->data).
                        super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        .memused, 0 < (long)uVar11)) {
      piVar9 = &pNVar3->idx;
      uVar12 = 0;
      do {
        if (*piVar9 == uVar7) {
          pcVar10 = (char *)(uVar12 & 0xffffffff);
          break;
        }
        uVar12 = uVar12 + 1;
        piVar9 = piVar9 + 0x15;
      } while (uVar11 != uVar12);
    }
    SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::remove((SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *)local_188,pcVar10);
    return;
  }
  local_148[0] = 0;
  local_148[1] = 0;
  stack0xfffffffffffffec0 = 0;
  uStack_13b = 0;
  local_158 = ZEXT816(0);
  local_168 = ZEXT816(0);
  local_178 = ZEXT816(0);
  if ((char)local_17c == '\0') {
    local_178._0_8_ = *(undefined8 *)(val->m_backend).data._M_elems;
    local_178._8_8_ = *(undefined8 *)((val->m_backend).data._M_elems + 2);
    local_168._0_8_ = *(undefined8 *)((val->m_backend).data._M_elems + 4);
    local_168._8_8_ = *(undefined8 *)((val->m_backend).data._M_elems + 6);
    local_158._0_8_ = *(undefined8 *)((val->m_backend).data._M_elems + 8);
    local_158._8_8_ = *(undefined8 *)((val->m_backend).data._M_elems + 10);
    local_148._0_8_ = *(undefined8 *)((val->m_backend).data._M_elems + 0xc);
    uVar5 = *(undefined8 *)((val->m_backend).data._M_elems + 0xe);
    stack0xfffffffffffffec0 = (undefined5)uVar5;
    uStack_13b = (undefined3)((ulong)uVar5 >> 0x28);
    iStack_138 = (val->m_backend).exp;
    bStack_134 = (val->m_backend).neg;
    local_130._0_4_ = (val->m_backend).fpclass;
    local_130._4_4_ = (val->m_backend).prec_elem;
  }
  else {
    local_88 = (val->m_backend).data._M_elems[0];
    uStack_84 = (val->m_backend).data._M_elems[1];
    uStack_80 = (val->m_backend).data._M_elems[2];
    uStack_7c = (val->m_backend).data._M_elems[3];
    local_78 = *(undefined8 *)((val->m_backend).data._M_elems + 4);
    uStack_70 = *(undefined8 *)((val->m_backend).data._M_elems + 6);
    local_68 = (val->m_backend).data._M_elems[8];
    uStack_64 = (val->m_backend).data._M_elems[9];
    uStack_60 = (val->m_backend).data._M_elems[10];
    uStack_5c = (val->m_backend).data._M_elems[0xb];
    local_58 = (val->m_backend).data._M_elems[0xc];
    uStack_54 = (val->m_backend).data._M_elems[0xd];
    uStack_50 = (val->m_backend).data._M_elems[0xe];
    uStack_4c = (val->m_backend).data._M_elems[0xf];
    local_48 = (val->m_backend).exp;
    local_44 = (val->m_backend).neg;
    local_40._0_4_ = (val->m_backend).fpclass;
    local_40._4_4_ = (val->m_backend).prec_elem;
    (*this->lp_scaler->_vptr_SPxScaler[0x2a])
              (&local_128,this->lp_scaler,this,(ulong)local_18c,(ulong)local_190);
    local_148[0] = local_128.data._M_elems[0xc];
    local_148[1] = local_128.data._M_elems[0xd];
    stack0xfffffffffffffec0 = local_128.data._M_elems._56_5_;
    uStack_13b = local_128.data._M_elems[0xf]._1_3_;
    local_158._0_4_ = local_128.data._M_elems[8];
    local_158._4_4_ = local_128.data._M_elems[9];
    local_158._8_4_ = local_128.data._M_elems[10];
    local_158._12_4_ = local_128.data._M_elems[0xb];
    local_168._0_4_ = local_128.data._M_elems[4];
    local_168._4_4_ = local_128.data._M_elems[5];
    local_168._8_4_ = local_128.data._M_elems[6];
    local_168._12_4_ = local_128.data._M_elems[7];
    local_178._0_4_ = local_128.data._M_elems[0];
    local_178._4_4_ = local_128.data._M_elems[1];
    local_178._8_4_ = local_128.data._M_elems[2];
    local_178._12_4_ = local_128.data._M_elems[3];
    iStack_138 = local_128.exp;
    bStack_134 = local_128.neg;
    local_130._0_4_ = local_128.fpclass;
    local_130._4_4_ = local_128.prec_elem;
  }
  pNVar3 = (this_02->data).
           super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           .m_elem;
  if ((pNVar3 != (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *)0x0) &&
     (lVar14 = (long)(this_02->data).
                     super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .memused, 0 < lVar14)) {
    lVar15 = 0;
    do {
      if (*(uint *)((long)(&pNVar3->val + 1) + lVar15) == uVar6) {
        pNVar4 = (local_188->data).
                 super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .m_elem;
        if ((pNVar4 != (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        *)0x0) &&
           (lVar15 = (long)(local_188->data).
                           super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           .memused, 0 < lVar15)) {
          lVar13 = 0;
          goto LAB_003a914d;
        }
        break;
      }
      lVar15 = lVar15 + 0x54;
    } while (lVar14 * 0x54 - lVar15 != 0);
  }
  goto LAB_003a9161;
  while( true ) {
    lVar15 = lVar15 + 1;
    piVar9 = piVar9 + 0x15;
    if (lVar14 == lVar15) break;
LAB_003a9225:
    if (*piVar9 == uVar6) goto LAB_003a923d;
  }
  lVar15 = -1;
LAB_003a923d:
  puVar1 = pNVar3[lVar15].val.m_backend.data._M_elems + 0xc;
  *(undefined8 *)puVar1 = local_148._0_8_;
  *(ulong *)(puVar1 + 2) = CONCAT35(uStack_13b,stack0xfffffffffffffec0);
  puVar1 = pNVar3[lVar15].val.m_backend.data._M_elems + 8;
  *(undefined8 *)puVar1 = local_158._0_8_;
  *(undefined8 *)(puVar1 + 2) = local_158._8_8_;
  puVar1 = pNVar3[lVar15].val.m_backend.data._M_elems + 4;
  *(undefined8 *)puVar1 = local_168._0_8_;
  *(undefined8 *)(puVar1 + 2) = local_168._8_8_;
  *(undefined8 *)pNVar3[lVar15].val.m_backend.data._M_elems = local_178._0_8_;
  *(undefined8 *)(pNVar3[lVar15].val.m_backend.data._M_elems + 2) = local_178._8_8_;
  pNVar3[lVar15].val.m_backend.exp = iStack_138;
  pNVar3[lVar15].val.m_backend.neg = bStack_134;
  pNVar3[lVar15].val.m_backend.fpclass = (fpclass_type)local_130;
  pNVar3[lVar15].val.m_backend.prec_elem = local_130._4_4_;
  pNVar3 = (local_188->data).
           super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           .m_elem;
  lVar15 = -1;
  lVar14 = lVar15;
  if ((pNVar3 != (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *)0x0) &&
     (lVar13 = (long)(local_188->data).
                     super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .memused, 0 < lVar13)) {
    piVar9 = &pNVar3->idx;
    lVar16 = 0;
    do {
      lVar14 = lVar16;
      if (*piVar9 == local_18c) break;
      lVar16 = lVar16 + 1;
      piVar9 = piVar9 + 0x15;
      lVar14 = lVar15;
    } while (lVar13 != lVar16);
  }
  puVar1 = pNVar3[lVar14].val.m_backend.data._M_elems + 0xc;
  *(undefined8 *)puVar1 = local_148._0_8_;
  *(ulong *)(puVar1 + 2) = CONCAT35(uStack_13b,stack0xfffffffffffffec0);
  puVar1 = pNVar3[lVar14].val.m_backend.data._M_elems + 8;
  *(undefined8 *)puVar1 = local_158._0_8_;
  *(undefined8 *)(puVar1 + 2) = local_158._8_8_;
  puVar1 = pNVar3[lVar14].val.m_backend.data._M_elems + 4;
  *(undefined8 *)puVar1 = local_168._0_8_;
  *(undefined8 *)(puVar1 + 2) = local_168._8_8_;
  *(undefined8 *)pNVar3[lVar14].val.m_backend.data._M_elems = local_178._0_8_;
  *(undefined8 *)(pNVar3[lVar14].val.m_backend.data._M_elems + 2) = local_178._8_8_;
  pNVar3[lVar14].val.m_backend.exp = iStack_138;
  pNVar3[lVar14].val.m_backend.neg = bStack_134;
  pNVar3[lVar14].val.m_backend.fpclass = (fpclass_type)local_130;
  pNVar3[lVar14].val.m_backend.prec_elem = local_130._4_4_;
  return;
  while (lVar13 = lVar13 + 0x54, lVar15 * 0x54 - lVar13 != 0) {
LAB_003a914d:
    if (*(uint *)((long)(&pNVar4->val + 1) + lVar13) == local_18c) {
      piVar9 = &pNVar3->idx;
      lVar15 = 0;
      goto LAB_003a9225;
    }
  }
LAB_003a9161:
  LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::add2(&this->
          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ,local_18c,1,(int *)&local_190,
         (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *)local_178);
  LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::add2(&this->
          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ,local_190,1,(int *)&local_18c,
         (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *)local_178);
  return;
}

Assistant:

virtual void changeElement(int i, int j, const R& val, bool scale = false)
   {
      if(i < 0 || j < 0)
         return;

      SVectorBase<R>& row = rowVector_w(i);
      SVectorBase<R>& col = colVector_w(j);

      if(isNotZero(val, this->tolerances()->epsilon()))
      {
         R newVal;

         if(scale)
         {
            assert(_isScaled);
            assert(lp_scaler);
            newVal = lp_scaler->scaleElement(*this, i, j, val);
         }
         else
            newVal = val;

         if(row.pos(j) >= 0 && col.pos(i) >= 0)
         {
            row.value(row.pos(j)) = newVal;
            col.value(col.pos(i)) = newVal;
         }
         else
         {
            LPRowSetBase<R>::add2(i, 1, &j, &newVal);
            LPColSetBase<R>::add2(j, 1, &i, &newVal);
         }
      }
      else if(row.pos(j) >= 0 && col.pos(i) >= 0)
      {
         row.remove(row.pos(j));
         col.remove(col.pos(i));
      }

      assert(isConsistent());
   }